

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

int aes256ctr_setup(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  ctr_context *ctx_1;
  
  ctx->do_dispose = ctr_dispose;
  ctx->do_init = ctr_init;
  ctx->do_transform = ctr_transform;
  ptls_fusion_aesecb_init((ptls_fusion_aesecb_context_t *)(ctx + 1),1,key,0x20);
  *(undefined1 *)&ctx[9].do_init = 0;
  return 0;
}

Assistant:

static int aes256ctr_setup(ptls_cipher_context_t *ctx, int is_enc, const void *key)
{
    return aesctr_setup(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}